

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_socket_manager.cpp
# Opt level: O2

utp_socket_impl * __thiscall
libtorrent::aux::utp_socket_manager::new_utp_socket(utp_socket_manager *this,utp_stream *str)

{
  long lVar1;
  __single_object impl;
  unsigned_short local_34;
  short local_32;
  _Head_base<0UL,_libtorrent::aux::utp_socket_impl_*,_false> local_30;
  undefined8 local_28;
  
  local_32 = (short)this->m_new_connection;
  local_28 = str;
  if (this->m_new_connection == -1) {
    lVar1 = random((aux *)0xffff);
    local_32 = (short)lVar1;
    local_34 = local_32 - 1;
  }
  else {
    local_34 = local_32 + 1;
    this->m_new_connection = -1;
  }
  ::std::
  make_unique<libtorrent::aux::utp_socket_impl,unsigned_short&,unsigned_short&,libtorrent::aux::utp_stream*&,libtorrent::aux::utp_socket_manager&>
            ((unsigned_short *)&local_30,&local_34,(utp_stream **)&local_32,
             (utp_socket_manager *)&stack0xffffffffffffffd8);
  ::std::
  _Rb_tree<unsigned_short,std::pair<unsigned_short_const,std::unique_ptr<libtorrent::aux::utp_socket_impl,std::default_delete<libtorrent::aux::utp_socket_impl>>>,std::_Select1st<std::pair<unsigned_short_const,std::unique_ptr<libtorrent::aux::utp_socket_impl,std::default_delete<libtorrent::aux::utp_socket_impl>>>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,std::unique_ptr<libtorrent::aux::utp_socket_impl,std::default_delete<libtorrent::aux::utp_socket_impl>>>>>
  ::
  _M_emplace_equal<unsigned_short&,std::unique_ptr<libtorrent::aux::utp_socket_impl,std::default_delete<libtorrent::aux::utp_socket_impl>>>
            ((_Rb_tree<unsigned_short,std::pair<unsigned_short_const,std::unique_ptr<libtorrent::aux::utp_socket_impl,std::default_delete<libtorrent::aux::utp_socket_impl>>>,std::_Select1st<std::pair<unsigned_short_const,std::unique_ptr<libtorrent::aux::utp_socket_impl,std::default_delete<libtorrent::aux::utp_socket_impl>>>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,std::unique_ptr<libtorrent::aux::utp_socket_impl,std::default_delete<libtorrent::aux::utp_socket_impl>>>>>
              *)&this->m_utp_sockets,&local_34,
             (unique_ptr<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>
              *)&local_30);
  ::std::
  unique_ptr<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>
  ::~unique_ptr((unique_ptr<libtorrent::aux::utp_socket_impl,_std::default_delete<libtorrent::aux::utp_socket_impl>_>
                 *)&local_30);
  return local_30._M_head_impl;
}

Assistant:

utp_socket_impl* utp_socket_manager::new_utp_socket(utp_stream* str)
	{
		std::uint16_t send_id = 0;
		std::uint16_t recv_id = 0;
		if (m_new_connection != -1)
		{
			send_id = std::uint16_t(m_new_connection);
			recv_id = std::uint16_t(m_new_connection + 1);
			m_new_connection = -1;
		}
		else
		{
			send_id = std::uint16_t(random(0xffff));
			recv_id = send_id - 1;
		}
		auto impl = std::make_unique<utp_socket_impl>(recv_id, send_id, str, *this);
		auto* const ret = impl.get();
		m_utp_sockets.emplace(recv_id, std::move(impl));
		return ret;
	}